

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

bool findInBlock(QTextBlock *block,QString *expression,int offset,FindFlags options,
                QTextCursor *cursor)

{
  QTextDocumentPrivate *p;
  QSharedDataPointer<QTextCursorPrivate> QVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int start;
  long in_FS_OFFSET;
  QTextCursor local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text((QString *)&local_58,block);
  QString::replace((QChar)(char16_t)&local_58,(QChar)0xa0,0x20);
  while ((-1 < offset && ((undefined1 *)(ulong)(uint)offset <= (ulong)local_58.size))) {
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) == 0) {
      uVar3 = QString::indexOf((QString *)&local_58,(longlong)expression,offset);
    }
    else {
      uVar3 = QString::lastIndexOf((QString *)&local_58,(longlong)expression,offset);
    }
    if (uVar3 == 0xffffffff) break;
    if ((((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                super_QFlagsStorage<QTextDocument::FindFlag>.i & 4) == 0) ||
       (((iVar4 = (int)(expression->d).size + uVar3, uVar3 == 0 ||
         (bVar2 = QChar::isLetterOrNumber
                            ((uint)*(ushort *)
                                    ((long)local_58.ptr +
                                    ((long)(((ulong)uVar3 << 0x20) + -0x100000000) >> 0x1f))),
         !bVar2)) &&
        (((undefined1 *)(long)iVar4 == (undefined1 *)local_58.size ||
         (bVar2 = QChar::isLetterOrNumber((uint)(ushort)local_58.ptr[iVar4]), !bVar2)))))) {
      p = block->p;
      iVar4 = QTextBlock::position(block);
      QTextCursor::QTextCursor(&local_60,p,uVar3 + iVar4);
      QVar1.d.ptr = (totally_ordered_wrapper<QTextCursorPrivate_*>)(cursor->d).d.ptr;
      (cursor->d).d.ptr = (QTextCursorPrivate *)local_60;
      local_60.d.d.ptr =
           (QSharedDataPointer<QTextCursorPrivate>)
           (QSharedDataPointer<QTextCursorPrivate>)QVar1.d.ptr;
      QTextCursor::~QTextCursor(&local_60);
      iVar4 = QTextCursor::position(cursor);
      QTextCursor::setPosition(cursor,iVar4 + (int)(expression->d).size,KeepAnchor);
      bVar2 = true;
      goto LAB_0045125d;
    }
    offset = iVar4 + CaseSensitive;
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) != 0) {
      offset = uVar3 - CaseSensitive;
    }
  }
  bVar2 = false;
LAB_0045125d:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QString &expression, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    Qt::CaseSensitivity sensitivity = options & QTextDocument::FindCaseSensitively ? Qt::CaseSensitive : Qt::CaseInsensitive;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expression, offset, sensitivity) : text.indexOf(expression, offset, sensitivity);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + expression.size();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + expression.size(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}